

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_WriteFailureExact_Test::TestBody
          (PrinterTest_WriteFailureExact_Test *this)

{
  bool bVar1;
  int size;
  void *data;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_2c0;
  Message local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_280;
  Message local_278;
  bool local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__2;
  string local_248;
  AssertHelper local_228;
  Message local_220;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__1;
  string local_1f0;
  AssertHelper local_1d0;
  Message local_1c8;
  bool local_1b9;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_;
  undefined1 local_198 [8];
  Printer printer;
  ArrayOutputStream output;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string buffer;
  PrinterTest_WriteFailureExact_Test *this_local;
  
  buffer.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,0x10,-0x56,&local_31);
  std::allocator<char>::~allocator(&local_31);
  data = (void *)std::__cxx11::string::operator[]((ulong)local_30);
  size = std::__cxx11::string::size();
  ArrayOutputStream::ArrayOutputStream((ArrayOutputStream *)&printer.field_0x128,data,size,-1);
  Printer::Printer((Printer *)local_198,(ZeroCopyOutputStream *)&printer.field_0x128,'$',
                   (AnnotationCollector *)0x0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
             "0123456789abcdef");
  Printer::Print<>((Printer *)local_198,stack0xfffffffffffffe58);
  local_1b9 = Printer::failed((Printer *)local_198);
  local_1b9 = !local_1b9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b8,&local_1b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(internal *)local_1b8,(AssertionResult *)"printer.failed()","true","false"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x1af,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__1.message_," ");
  Printer::Print<>((Printer *)local_198,stack0xfffffffffffffe00);
  local_211 = Printer::failed((Printer *)local_198);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_210,&local_211,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_248,(internal *)local_210,(AssertionResult *)"printer.failed()","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x1b3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__2.message_,"blah");
  Printer::Print<>((Printer *)local_198,stack0xfffffffffffffda8);
  local_269 = Printer::failed((Printer *)local_198);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_268,&local_269,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_268,
               (AssertionResult *)"printer.failed()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x1b7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[17],_nullptr>
            ((EqHelper *)local_2b0,"buffer","\"0123456789abcdef\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [17])0x212de29);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x1ba,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  Printer::~Printer((Printer *)local_198);
  ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&printer.field_0x128);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(PrinterTest, WriteFailureExact) {
  std::string buffer(16, '\xaa');
  ArrayOutputStream output(&buffer[0], buffer.size());
  Printer printer(&output, '$');

  // Print 16 bytes to fill the buffer exactly (should not fail).
  printer.Print("0123456789abcdef");
  EXPECT_FALSE(printer.failed());

  // Try to print one more byte (should fail).
  printer.Print(" ");
  EXPECT_TRUE(printer.failed());

  // Should not crash
  printer.Print("blah");
  EXPECT_TRUE(printer.failed());

  // Buffer should contain the first 16 bytes written.
  EXPECT_EQ(buffer, "0123456789abcdef");
}